

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

mFILE * mstdout(void)

{
  mFILE *local_10;
  
  if (m_channel[1] == (mFILE *)0x0) {
    m_channel[1] = mfcreate((char *)0x0,0);
    if (m_channel[1] == (mFILE *)0x0) {
      local_10 = (mFILE *)0x0;
    }
    else {
      m_channel[1]->fp = _stdout;
      m_channel[1]->mode = 2;
      local_10 = m_channel[1];
    }
  }
  else {
    local_10 = m_channel[1];
  }
  return local_10;
}

Assistant:

mFILE *mstdout(void) {
    if (m_channel[1])
	return m_channel[1];

    m_channel[1] = mfcreate(NULL, 0);
    if (NULL == m_channel[1]) return NULL;
    m_channel[1]->fp = stdout;
    m_channel[1]->mode = MF_WRITE;
    return m_channel[1];
}